

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.h
# Opt level: O0

char * __thiscall
Memory::
SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::InlinedAllocImpl<false>
          (SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,Recycler *recycler,size_t sizeCat,ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  FreeObject *pFVar5;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  SmallHeapBlockBitVector *this_01;
  undefined8 *in_FS_OFFSET;
  BOOL isSet;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *smallBlock;
  HeapBlock *heapBlock;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *allocationHeapBlock;
  char *endAddress;
  char *nextCurrentAddress;
  char *memBlock;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  ObjectInfoBits attributes_local;
  size_t sizeCat_local;
  Recycler *recycler_local;
  SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  *this_local;
  
  memBlock._6_2_ = attributes;
  ___autoFilterExceptionRegion = sizeCat;
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                       ,0x74,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((((Js::Configuration::Global[0x2c156] & 1) != 0) &&
      ((memBlock._6_2_ & WithBarrierBit) == NoBit)) && ((memBlock._6_2_ & LeafBit) == NoBit)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                       ,0x76,
                       "(!(Js::Configuration::Global.flags.ForceSoftwareWriteBarrier) || (attributes & WithBarrierBit) || (attributes & LeafBit))"
                       ,
                       "!CONFIG_FLAG(ForceSoftwareWriteBarrier) || (attributes & WithBarrierBit) || (attributes & LeafBit)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  AutoFilterExceptionRegion::AutoFilterExceptionRegion
            ((AutoFilterExceptionRegion *)&memBlock,ExceptionType_All);
  this_local = (SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)this->freeObjectList;
  pFVar5 = (FreeObject *)
           ((long)&(((FinalizableObject *)&this_local->endAddress)->super_IRecyclerVisitedObject).
                   _vptr_IRecyclerVisitedObject + ___autoFilterExceptionRegion);
  if ((FreeObject *)this->endAddress < pFVar5) {
    if ((this_local ==
         (SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          *)0x0) || ((FreeObject *)this->endAddress != (FreeObject *)0x0)) {
      this_local = (SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                    *)0x0;
    }
    else {
      pFVar5 = FreeObject::GetNext((FreeObject *)this_local);
      this->freeObjectList = pFVar5;
      FreeObject::DebugFillNext((FreeObject *)this_local);
      bVar2 = IsBumpAllocMode(this);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                           ,0xa6,"(!this->IsBumpAllocMode())","!this->IsBumpAllocMode()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      bVar2 = NeedSetAttributes(memBlock._6_2_);
      if (bVar2) {
        heapBlock = (HeapBlock *)this->heapBlock;
        if (heapBlock == (HeapBlock *)0x0) {
          bVar2 = IsExplicitFreeObjectListAllocMode(this);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                               ,0xac,"(this->IsExplicitFreeObjectListAllocMode())",
                               "this->IsExplicitFreeObjectListAllocMode()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          heapBlock = Recycler::FindHeapBlock(recycler,this_local);
          if (heapBlock == (HeapBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                               ,0xae,"(allocationHeapBlock != nullptr)",
                               "allocationHeapBlock != nullptr");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          bVar2 = HeapBlock::IsLargeHeapBlock(heapBlock);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                               ,0xaf,"(!allocationHeapBlock->IsLargeHeapBlock())",
                               "!allocationHeapBlock->IsLargeHeapBlock()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
        }
        if ((memBlock._6_2_ & (FinalizeBit|TrackBit)) != NoBit) {
          memset(this_local,0,8);
          DummyVTableObject::DummyVTableObject((DummyVTableObject *)this_local);
        }
        SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::SetAttributes
                  ((SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock,
                   this_local,memBlock._6_1_);
      }
      bVar2 = IsExplicitFreeObjectListAllocMode(this);
      if (bVar2) {
        this_00 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                  Recycler::FindHeapBlock(recycler,this_local);
        if (this_00 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                             ,0xc2,"(heapBlock != nullptr)","heapBlock != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        bVar2 = HeapBlock::IsLargeHeapBlock((HeapBlock *)this_00);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                             ,0xc3,"(!heapBlock->IsLargeHeapBlock())",
                             "!heapBlock->IsLargeHeapBlock()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        SmallHeapBlockT<SmallAllocationBlockAttributes>::ClearExplicitFreeBitForObject
                  (this_00,this_local);
      }
      bVar2 = IsExplicitFreeObjectListAllocMode(this);
      if (!bVar2) {
        this_01 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetDebugFreeBitVector
                            ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this->heapBlock);
        uVar4 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddressBitIndex(this_local);
        BVar3 = BVStatic<256UL>::TestAndClear(this_01,(uint)uVar4);
        if (BVar3 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                             ,0xcd,"(isSet)","isSet");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
      }
    }
  }
  else {
    bVar2 = IsBumpAllocMode(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                         ,0x86,"(this->IsBumpAllocMode())","this->IsBumpAllocMode()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    TrackNativeAllocatedObjects(this);
    this->lastNonNativeBumpAllocatedBlock = (char *)this_local;
    this->freeObjectList = pFVar5;
    bVar2 = NeedSetAttributes(memBlock._6_2_);
    if (bVar2) {
      if ((memBlock._6_2_ & (FinalizeBit|TrackBit)) != NoBit) {
        memset(this_local,0,8);
        DummyVTableObject::DummyVTableObject((DummyVTableObject *)this_local);
      }
      SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::SetAttributes
                (&this->heapBlock->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,
                 this_local,memBlock._6_1_);
    }
  }
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion((AutoFilterExceptionRegion *)&memBlock);
  return (char *)this_local;
}

Assistant:

inline char*
SmallHeapBlockAllocator<TBlockType>::InlinedAllocImpl(Recycler * recycler, DECLSPEC_GUARD_OVERFLOW size_t sizeCat, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);
#ifdef RECYCLER_WRITE_BARRIER
    Assert(!CONFIG_FLAG(ForceSoftwareWriteBarrier) || (attributes & WithBarrierBit) || (attributes & LeafBit));
#endif

    AUTO_NO_EXCEPTION_REGION;
    if (canFaultInject)
    {
        FAULTINJECT_MEMORY_NOTHROW(_u("InlinedAllocImpl"), sizeCat);
    }

    char * memBlock = (char *)freeObjectList;
    char * nextCurrentAddress = memBlock + sizeCat;
    char * endAddress = this->endAddress;

    if (nextCurrentAddress <= endAddress)
    {
        // Bump Allocation
        Assert(this->IsBumpAllocMode());
#ifdef RECYCLER_TRACK_NATIVE_ALLOCATED_OBJECTS
        TrackNativeAllocatedObjects();
        lastNonNativeBumpAllocatedBlock = memBlock;
#endif
        freeObjectList = (FreeObject *)nextCurrentAddress;

        if (NeedSetAttributes(attributes))
        {
            if ((attributes & (FinalizeBit | TrackBit)) != 0)
            {
                // Make sure a valid vtable is installed as once the attributes have been set this allocation may be traced by background marking
                memBlock = (char *)new (memBlock) DummyVTableObject();
#if defined(_M_ARM32_OR_ARM64)
                // On ARM, make sure the v-table write is performed before setting the attributes
                MemoryBarrier();
#endif
            }
            heapBlock->SetAttributes(memBlock, (attributes & StoredObjectInfoBitMask));
        }

        return memBlock;
    }

    if (memBlock != nullptr && endAddress == nullptr)
    {
        // Free list allocation
        freeObjectList = ((FreeObject *)memBlock)->GetNext();
#ifdef RECYCLER_MEMORY_VERIFY
        ((FreeObject *)memBlock)->DebugFillNext();
#endif
        
        Assert(!this->IsBumpAllocMode());
        if (NeedSetAttributes(attributes))
        {
            TBlockType * allocationHeapBlock = this->heapBlock;
            if (allocationHeapBlock == nullptr)
            {
                Assert(this->IsExplicitFreeObjectListAllocMode());
                allocationHeapBlock = (TBlockType *)recycler->FindHeapBlock(memBlock);
                Assert(allocationHeapBlock != nullptr);
                Assert(!allocationHeapBlock->IsLargeHeapBlock());
            }

            if ((attributes & (FinalizeBit | TrackBit)) != 0)
            {
                // Make sure a valid vtable is installed as once the attributes have been set this allocation may be traced by background marking
                memBlock = (char *)new (memBlock) DummyVTableObject();
#if defined(_M_ARM32_OR_ARM64)
                // On ARM, make sure the v-table write is performed before setting the attributes
                MemoryBarrier();
#endif
            }
            allocationHeapBlock->SetAttributes(memBlock, (attributes & StoredObjectInfoBitMask));
        }

#ifdef RECYCLER_MEMORY_VERIFY
        if (this->IsExplicitFreeObjectListAllocMode())
        {
            HeapBlock* heapBlock = recycler->FindHeapBlock(memBlock);
            Assert(heapBlock != nullptr);
            Assert(!heapBlock->IsLargeHeapBlock());
            TBlockType* smallBlock = (TBlockType*)heapBlock;
            smallBlock->ClearExplicitFreeBitForObject(memBlock);
        }
#endif

#if DBG || defined(RECYCLER_STATS)
        if (!IsExplicitFreeObjectListAllocMode())
        {
            BOOL isSet = heapBlock->GetDebugFreeBitVector()->TestAndClear(heapBlock->GetAddressBitIndex(memBlock));
            Assert(isSet);
        }
#endif
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        // If we are allocating during concurrent sweep we must mark the object to prevent it from being swept
        // in the ongoing sweep.
        if (heapBlock != nullptr && heapBlock->isPendingConcurrentSweepPrep)
        {
            AssertMsg(!this->isAllocatingFromNewBlock, "We shouldn't be tracking allocation to a new block; i.e. bump allocation; during concurrent sweep.");
            AssertMsg(!heapBlock->IsAnyFinalizableBlock(), "Allocations are not allowed to finalizable blocks during concurrent sweep.");
            AssertMsg(heapBlock->heapBucket->AllocationsStartedDuringConcurrentSweep(), "We shouldn't be allocating from this block while allocations are disabled.");

            // Explcitly mark this object and also clear the free bit.
            heapBlock->SetObjectMarkedBit(memBlock);
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
            uint bitIndex = heapBlock->GetAddressBitIndex(memBlock);
            heapBlock->GetDebugFreeBitVector()->Clear(bitIndex);
            heapBlock->objectsMarkedDuringSweep++;
#endif

#ifdef RECYCLER_TRACE
            if (recycler->GetRecyclerFlagsTable().Trace.IsEnabled(Js::ConcurrentSweepPhase) && recycler->GetRecyclerFlagsTable().Trace.IsEnabled(Js::MemoryAllocationPhase) && CONFIG_FLAG_RELEASE(Verbose))
            {
                Output::Print(_u("[**33**]FreeListAlloc: Object 0x%p from HeapBlock 0x%p used for allocation during ConcurrentSweep [CollectionState: %d] \n"), memBlock, heapBlock, static_cast<CollectionState>(recycler->collectionState));
            }
#endif
        }
#endif
        return memBlock;
    }

    return nullptr;
}